

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

bool __thiscall cfd::Psbt::HasAllUtxos(Psbt *this)

{
  string *message;
  undefined8 uVar1;
  long in_RDI;
  size_t index;
  wally_psbt *psbt_pointer;
  string *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  allocator *paVar2;
  CfdError error_code;
  CfdException *in_stack_ffffffffffffff50;
  ulong uVar3;
  allocator local_a1;
  string local_a0 [32];
  CfdSourceLocation local_80;
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  CfdSourceLocation local_30;
  long local_18;
  
  error_code = (CfdError)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_18 = *(long *)(in_RDI + 8);
  if (local_18 == 0) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0xef;
    local_30.funcname = "HasAllUtxos";
    core::logger::warn<>(&local_30,"psbt pointer is null");
    local_65 = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar2 = &local_51;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"psbt pointer is null.",paVar2);
    core::CfdException::CfdException
              (in_stack_ffffffffffffff50,(CfdError)((ulong)paVar2 >> 0x20),message);
    local_65 = 0;
    __cxa_throw(message,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (*(long *)(local_18 + 8) != 0) {
    uVar3 = 0;
    while( true ) {
      if (*(ulong *)(local_18 + 0x18) <= uVar3) {
        return *(long *)(local_18 + 0x18) != 0;
      }
      if ((*(long *)(*(long *)(local_18 + 0x10) + uVar3 * 0x110 + 8) == 0) &&
         (*(long *)(*(long *)(local_18 + 0x10) + uVar3 * 0x110) == 0)) break;
      uVar3 = uVar3 + 1;
    }
    return false;
  }
  local_80.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/cfd_psbt.cpp"
               ,0x2f);
  local_80.filename = local_80.filename + 1;
  local_80.line = 0xf3;
  local_80.funcname = "HasAllUtxos";
  core::logger::warn<>(&local_80,"psbt base tx is null");
  uVar1 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"psbt base tx is null.",&local_a1);
  core::CfdException::CfdException(in_stack_ffffffffffffff50,error_code,in_stack_ffffffffffffff40);
  __cxa_throw(uVar1,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool Psbt::HasAllUtxos() const {
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt pointer is null.");
  } else if (psbt_pointer->tx == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt base tx is null");
    throw CfdException(
        CfdError::kCfdIllegalStateError, "psbt base tx is null.");
  }

  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if ((psbt_pointer->inputs[index].witness_utxo == nullptr) &&
        (psbt_pointer->inputs[index].utxo == nullptr)) {
      return false;
    }
  }
  return (psbt_pointer->num_inputs != 0);
}